

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_functionBytecodeAssembler_jumpIfTrue
          (sysbvm_context_t *context,sysbvm_functionBytecodeAssembler_t *assembler,
          sysbvm_tuple_t condition,sysbvm_tuple_t destination)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t instruction;
  sysbvm_tuple_t operands;
  sysbvm_tuple_t destination_local;
  sysbvm_tuple_t condition_local;
  sysbvm_functionBytecodeAssembler_t *assembler_local;
  sysbvm_context_t *context_local;
  
  sVar1 = sysbvm_array_create(context,2);
  sysbvm_array_atPut(sVar1,0,condition);
  sysbvm_array_atPut(sVar1,1,destination);
  sVar1 = sysbvm_functionBytecodeAssemblerInstruction_create(context,'%',sVar1);
  sysbvm_functionBytecodeAssembler_addInstruction(assembler,sVar1);
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionBytecodeAssembler_jumpIfTrue(sysbvm_context_t *context, sysbvm_functionBytecodeAssembler_t *assembler, sysbvm_tuple_t condition, sysbvm_tuple_t destination)
{
    sysbvm_tuple_t operands = sysbvm_array_create(context, 2);
    sysbvm_array_atPut(operands, 0, condition);
    sysbvm_array_atPut(operands, 1, destination);

    sysbvm_tuple_t instruction = sysbvm_functionBytecodeAssemblerInstruction_create(context, SYSBVM_OPCODE_JUMP_IF_TRUE, operands);
    sysbvm_functionBytecodeAssembler_addInstruction(assembler, instruction);
    return instruction;
}